

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedMemory.cpp
# Opt level: O2

void * __thiscall SharedMemory::attach(SharedMemory *this,AttachFlag flag,void *address)

{
  void *pvVar1;
  int *piVar2;
  undefined1 local_60 [32];
  anon_union_8_2_1a2b307e_for_Flags<LogOutput::LogFlag>_1 local_40 [4];
  Log local_20;
  
  pvVar1 = this->mAddr;
  if (pvVar1 == (void *)0x0) {
    pvVar1 = shmat(this->mShm,address,
                   ((flag & ReadWrite) << 0xc | (uint)(address != (void *)0x0) << 0xd) ^ 0x1000);
    this->mAddr = pvVar1;
    if (pvVar1 == (void *)0xffffffffffffffff) {
      local_40[0].mValue = 1;
      Log::Log((Log *)local_60,LogLevel::Error,(Flags<LogOutput::LogFlag> *)local_40);
      piVar2 = __errno_location();
      Rct::strerror((Rct *)local_40,*piVar2);
      operator<<((Log *)(local_60 + 0x10),(String *)local_60);
      Log::addStringStream<int>(&local_20,(int)local_60 + 0x10);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_20.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 0x18));
      std::__cxx11::string::~string((string *)local_40);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
      this->mAddr = (void *)0x0;
      pvVar1 = (void *)0x0;
    }
  }
  return pvVar1;
}

Assistant:

void* SharedMemory::attach(AttachFlag flag, void* address)
{
    if (mAddr)
        return mAddr;

    int flg = address ? SHM_RND : 0;
    if (!(flag & Write))
        flg |= SHM_RDONLY;
    mAddr = shmat(mShm, address, flg);
    if (mAddr == reinterpret_cast<void*>(-1)) {
        error() << Rct::strerror() << errno;
        mAddr = 0;
    }
    return mAddr;
}